

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O1

void __thiscall
DStrifeStatusBar::DrINumber2(DStrifeStatusBar *this,int val,int x,int y,int width,int imgBase)

{
  DFrameBuffer *pDVar1;
  FTexture *pFVar2;
  int iVar3;
  uint uVar4;
  
  pDVar1 = screen;
  iVar3 = x - width;
  if (val != 0) {
    do {
      pDVar1 = screen;
      pFVar2 = FImageCollection::operator[](&this->Images,val % 10 + imgBase);
      DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar2,(double)iVar3,(double)y,0x40001393,1,0);
      iVar3 = iVar3 - width;
      uVar4 = val + 9;
      val = val / 10;
    } while (0x12 < uVar4);
    return;
  }
  pFVar2 = FImageCollection::operator[](&this->Images,imgBase);
  DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar2,(double)iVar3,(double)y,0x40001393,1,0);
  return;
}

Assistant:

void DrINumber2 (signed int val, int x, int y, int width, int imgBase) const
	{
		x -= width;

		if (val == 0)
		{
			screen->DrawTexture (Images[imgBase], x, y, DTA_CleanNoMove, true, TAG_DONE);
		}
		else
		{
			while (val != 0)
			{
				screen->DrawTexture (Images[imgBase+val%10], x, y, DTA_CleanNoMove, true, TAG_DONE);
				val /= 10;
				x -= width;
			}
		}
	}